

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall
Saturation::SaturationAlgorithm::backwardSimplify(SaturationAlgorithm *this,Clause *cl)

{
  long *plVar1;
  BackwardSimplificationEngine **ppBVar2;
  char cVar3;
  Clause *cl_00;
  BwSimplList *pBVar4;
  undefined1 auVar5 [16];
  BwSimplificationRecordIterator simplifications;
  Clause *replacement;
  long *local_40;
  Clause *local_38;
  
  pBVar4 = this->_bwSimplifiers;
  if (pBVar4 != (BwSimplList *)0x0) {
    do {
      ppBVar2 = &pBVar4->_head;
      pBVar4 = pBVar4->_tail;
      local_40 = (long *)0x0;
      (*((*ppBVar2)->super_InferenceEngine)._vptr_InferenceEngine[5])(*ppBVar2,cl,&local_40);
      while( true ) {
        cVar3 = (**(code **)(*local_40 + 0x10))();
        if (cVar3 == '\0') break;
        auVar5 = (**(code **)(*local_40 + 0x18))();
        local_38 = auVar5._8_8_;
        cl_00 = auVar5._0_8_;
        if (local_38 != (Clause *)0x0) {
          addNewClause(this,local_38);
        }
        onClauseReduction(this,cl_00,&local_38,1,cl,false);
        cl_00->_refCnt = cl_00->_refCnt + 1;
        removeActiveOrPassiveClause(this,cl_00);
        cl_00->_refCnt = cl_00->_refCnt - 1;
        Kernel::Clause::destroyIfUnnecessary(cl_00);
      }
      if (local_40 != (long *)0x0) {
        plVar1 = local_40 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        if ((int)*plVar1 == 0) {
          (**(code **)(*local_40 + 8))();
        }
      }
    } while (pBVar4 != (List<Inferences::BackwardSimplificationEngine_*> *)0x0);
  }
  return;
}

Assistant:

void SaturationAlgorithm::backwardSimplify(Clause* cl)
{
  TIME_TRACE("backward simplification");

  BwSimplList::Iterator bsit(_bwSimplifiers);
  while (bsit.hasNext()) {
    BackwardSimplificationEngine *bse = bsit.next();

    BwSimplificationRecordIterator simplifications;
    bse->perform(cl, simplifications);
    while (simplifications.hasNext()) {
      BwSimplificationRecord srec = simplifications.next();
      Clause *redundant = srec.toRemove;
      ASS_NEQ(redundant, cl);

      Clause *replacement = srec.replacement;

      if (replacement) {
        addNewClause(replacement);
      }
      onClauseReduction(redundant, &replacement, 1, cl, false);

      // we must remove the redundant clause before adding its replacement,
      // as otherwise the redundant one might demodulate the replacement into
      // a tautology

      redundant->incRefCnt(); // we don't want the clause deleted before we record the simplification

      removeActiveOrPassiveClause(redundant);

      redundant->decRefCnt();
    }
  }
}